

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_write_key_anchor(Parser *this,size_t node_id)

{
  csubstr fmt;
  csubstr fmt_00;
  csubstr anchor;
  csubstr ref;
  csubstr ref_00;
  bool bVar1;
  error_flags eVar2;
  int iVar3;
  csubstr *pcVar4;
  char *in_RSI;
  size_t in_RDI;
  size_t i;
  csubstr r;
  char msg [41];
  basic_substring<const_char> *in_stack_000002f8;
  Parser *in_stack_00000300;
  char *in_stack_00000308;
  size_t in_stack_00000310;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 uVar5;
  Tree *in_stack_fffffffffffffe80;
  Tree *in_stack_fffffffffffffe88;
  Tree *in_stack_fffffffffffffe98;
  Tree *in_stack_fffffffffffffea0;
  basic_substring<const_char> *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  size_t local_148;
  basic_substring<const_char> local_120;
  undefined8 local_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  char *local_e0;
  char *local_a0;
  pfn_allocate local_90;
  char *local_88;
  undefined4 local_80;
  char *local_78;
  basic_substring<const_char> *local_70;
  char *local_50;
  NodeData *local_48;
  char *local_40;
  size_t local_38;
  NodeData *local_30;
  char *local_28;
  basic_substring<const_char> *local_20;
  char *local_18;
  size_t local_10;
  NodeData *local_8;
  
  local_50 = *(char **)(in_RDI + 0x30);
  local_a0 = in_RSI;
  local_48 = Tree::_p(in_stack_fffffffffffffe80,
                      CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  if (((local_48->m_type).type & KEY) == NOTYPE) {
    memcpy(&stack0xffffffffffffff28,"check failed: (m_tree->has_key(node_id))",0x29);
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    in_stack_fffffffffffffe88 = *(Tree **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffe80 = (Tree *)&stack0xffffffffffffff28;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*(code *)in_stack_fffffffffffffe88)
              (in_stack_fffffffffffffe80,0x29,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe28 = local_100;
    in_stack_fffffffffffffe2c = uStack_fc;
    in_stack_fffffffffffffe30 = uStack_f8;
    in_stack_fffffffffffffe34 = uStack_f4;
    in_stack_fffffffffffffe40 = uStack_e8;
    in_stack_fffffffffffffe44 = uStack_e4;
    in_stack_fffffffffffffe48 = local_e0;
  }
  local_90 = (pfn_allocate)(in_RDI + 0xa50);
  uVar5 = true;
  if (*(long *)(in_RDI + 0xa58) != 0) {
    uVar5 = *(long *)local_90 == 0;
  }
  if ((bool)uVar5 == false) {
    local_110 = *(undefined8 *)(in_RDI + 0xa50);
    local_108 = *(undefined8 *)(in_RDI + 0xa58);
    anchor.len = (size_t)in_stack_fffffffffffffea8;
    anchor.str = (char *)in_stack_fffffffffffffea0;
    Tree::set_key_anchor(in_stack_fffffffffffffe98,in_RDI,anchor);
    basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0xa50));
    *(undefined1 *)(in_RDI + 0xa40) = 0;
    *(undefined8 *)(in_RDI + 0xa48) = 0;
  }
  else {
    local_10 = *(size_t *)(in_RDI + 0x30);
    local_18 = local_a0;
    local_8 = Tree::_p(in_stack_fffffffffffffe80,CONCAT17(uVar5,in_stack_fffffffffffffe78));
    if (((local_8->m_type).type & (KEYQUO|KEY)) != (KEYQUO|KEY)) {
      pcVar4 = Tree::key(in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
      local_120.str = pcVar4->str;
      local_120.len = pcVar4->len;
      bVar1 = basic_substring<const_char>::begins_with(&local_120,'*');
      if (bVar1) {
        local_70 = &local_120;
        local_78 = (char *)0x1;
        if (local_120.len == 0) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) &&
             (in_stack_fffffffffffffe57 = is_debugger_attached(), (bool)in_stack_fffffffffffffe57))
          {
            trap_instruction();
          }
          local_88 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_80 = 0x1533;
          handle_error(0x345f1b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe48,
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        ref.len = in_stack_fffffffffffffeb0;
        ref.str = (char *)in_stack_fffffffffffffea8;
        Tree::set_key_ref(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,ref);
      }
      else {
        local_20 = &local_120;
        local_28 = "<<";
        iVar3 = basic_substring<const_char>::compare
                          (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                           (size_t)in_stack_fffffffffffffe98);
        if (iVar3 == 0) {
          ref_00.len = in_stack_fffffffffffffeb0;
          ref_00.str = (char *)in_stack_fffffffffffffea8;
          Tree::set_key_ref(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,ref_00);
          local_38 = *(size_t *)(in_RDI + 0x30);
          local_40 = local_a0;
          local_30 = Tree::_p(in_stack_fffffffffffffe80,CONCAT17(uVar5,in_stack_fffffffffffffe78));
          if (((local_30->m_type).type & SEQ) == NOTYPE) {
            pcVar4 = Tree::val(in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
            bVar1 = basic_substring<const_char>::begins_with(pcVar4,'*');
            if (!bVar1) {
              bVar1 = is_debugger_attached();
              if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              basic_substring<char_const>::basic_substring<33ul>
                        ((basic_substring<char_const> *)&stack0xfffffffffffffe98,
                         (char (*) [33])"ERROR: malformed reference: \'{}\'");
              Tree::val(in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
              fmt_00.len = in_stack_00000310;
              fmt_00.str = in_stack_00000308;
              _err<c4::basic_substring<char_const>>(in_stack_00000300,fmt_00,in_stack_000002f8);
            }
          }
          else {
            local_148 = Tree::first_child((Tree *)CONCAT44(in_stack_fffffffffffffe34,
                                                           in_stack_fffffffffffffe30),
                                          CONCAT44(in_stack_fffffffffffffe2c,
                                                   in_stack_fffffffffffffe28));
            while (local_148 != 0xffffffffffffffff) {
              pcVar4 = Tree::val(in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
              bVar1 = basic_substring<const_char>::begins_with(pcVar4,'*');
              if (!bVar1) {
                bVar1 = is_debugger_attached();
                if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
                  trap_instruction();
                }
                basic_substring<char_const>::basic_substring<33ul>
                          ((basic_substring<char_const> *)&stack0xfffffffffffffea8,
                           (char (*) [33])"ERROR: malformed reference: \'{}\'");
                Tree::val(in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
                fmt.len = in_stack_00000310;
                fmt.str = in_stack_00000308;
                _err<c4::basic_substring<char_const>>(in_stack_00000300,fmt,in_stack_000002f8);
              }
              local_148 = Tree::next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffe34,
                                                              in_stack_fffffffffffffe30),
                                             CONCAT44(in_stack_fffffffffffffe2c,
                                                      in_stack_fffffffffffffe28));
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Parser::_write_key_anchor(size_t node_id)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->has_key(node_id));
    if( ! m_key_anchor.empty())
    {
        _c4dbgpf("node={}: set key anchor to '{}'", node_id, m_key_anchor);
        m_tree->set_key_anchor(node_id, m_key_anchor);
        m_key_anchor.clear();
        m_key_anchor_was_before = false;
        m_key_anchor_indentation = 0;
    }
    else if( ! m_tree->is_key_quoted(node_id))
    {
        csubstr r = m_tree->key(node_id);
        if(r.begins_with('*'))
        {
            _c4dbgpf("node={}: set key reference: '{}'", node_id, r);
            m_tree->set_key_ref(node_id, r.sub(1));
        }
        else if(r == "<<")
        {
            m_tree->set_key_ref(node_id, r);
            _c4dbgpf("node={}: it's an inheriting reference", node_id);
            if(m_tree->is_seq(node_id))
            {
                _c4dbgpf("node={}: inheriting from seq of {}", node_id, m_tree->num_children(node_id));
                for(size_t i = m_tree->first_child(node_id); i != NONE; i = m_tree->next_sibling(i))
                {
                    if( ! (m_tree->val(i).begins_with('*')))
                        _c4err("malformed reference: '{}'", m_tree->val(i));
                }
            }
            else if( ! m_tree->val(node_id).begins_with('*'))
            {
                 _c4err("malformed reference: '{}'", m_tree->val(node_id));
            }
            //m_tree->set_key_ref(node_id, r);
        }
    }
}